

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

MXF * __thiscall ASDCP::MXF::SeekToRIP(MXF *this,IFileReader *Reader)

{
  int iVar1;
  uint i;
  ILogSink *pIVar2;
  Result_t local_250 [108];
  undefined4 local_1e4;
  Result_t local_1e0 [108];
  ui32_t local_174;
  byte_t local_170 [4];
  ui32_t rip_size;
  byte_t intbuf [4];
  ui32_t read_count;
  Result_t local_100 [120];
  Result_t local_88 [8];
  Result_t result;
  long local_20;
  fpos_t end_pos;
  IFileReader *Reader_local;
  
  end_pos = (fpos_t)Reader;
  Reader_local = (IFileReader *)this;
  (**(code **)(*(long *)Reader + 0x28))(local_88,Reader,0);
  iVar1 = Kumu::Result_t::operator_cast_to_int(local_88);
  if (-1 < iVar1) {
    (**(code **)(*(long *)end_pos + 0x30))(local_100,end_pos,&local_20);
    Kumu::Result_t::operator=(local_88,local_100);
    Kumu::Result_t::~Result_t(local_100);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int(local_88);
  if ((-1 < iVar1) && (local_20 < 0x14)) {
    pIVar2 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar2,"File is smaller than an empty KLV packet.\n");
    Kumu::Result_t::operator=(local_88,(Result_t *)Kumu::RESULT_FAIL);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int(local_88);
  if (-1 < iVar1) {
    (**(code **)(*(long *)end_pos + 0x28))(intbuf,end_pos,local_20 + -4);
    Kumu::Result_t::operator=(local_88,(Result_t *)intbuf);
    Kumu::Result_t::~Result_t((Result_t *)intbuf);
  }
  local_174 = 0;
  iVar1 = Kumu::Result_t::operator_cast_to_int(local_88);
  if (-1 < iVar1) {
    (**(code **)(*(long *)end_pos + 0x38))(local_1e0,end_pos,local_170,4,&rip_size);
    Kumu::Result_t::operator=(local_88,local_1e0);
    Kumu::Result_t::~Result_t(local_1e0);
    iVar1 = Kumu::Result_t::operator_cast_to_int(local_88);
    if ((-1 < iVar1) && (rip_size != 4)) {
      pIVar2 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar2,"RIP contains fewer than four bytes.\n");
      Kumu::Result_t::operator=(local_88,(Result_t *)Kumu::RESULT_FAIL);
    }
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int(local_88);
  if (-1 < iVar1) {
    i = Kumu::cp2i<unsigned_int>(local_170);
    local_174 = Kumu::Swap4(i);
    if (local_20 < (long)(ulong)local_174) {
      pIVar2 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar2,"RIP size impossibly large.\n");
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_FAIL);
      goto LAB_00235499;
    }
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int(local_88);
  if (-1 < iVar1) {
    (**(code **)(*(long *)end_pos + 0x28))(local_250,end_pos,local_20 - (ulong)local_174,0);
    Kumu::Result_t::operator=(local_88,local_250);
    Kumu::Result_t::~Result_t(local_250);
  }
  Kumu::Result_t::Result_t((Result_t *)this,local_88);
LAB_00235499:
  local_1e4 = 1;
  Kumu::Result_t::~Result_t(local_88);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::SeekToRIP(const Kumu::IFileReader& Reader)
{
  Kumu::fpos_t end_pos;

  // go to the end - 4 bytes
  Result_t result = Reader.Seek(0, Kumu::SP_END);

  if ( ASDCP_SUCCESS(result) )
    result = Reader.Tell(&end_pos);

  if ( ASDCP_SUCCESS(result)
       && end_pos < (SMPTE_UL_LENGTH+MXF_BER_LENGTH) )
    {
      DefaultLogSink().Error("File is smaller than an empty KLV packet.\n");
      result = RESULT_FAIL;
    }

  if ( ASDCP_SUCCESS(result) )
    result = Reader.Seek(end_pos - 4);

  // get the ui32_t RIP length
  ui32_t read_count;
  byte_t intbuf[MXF_BER_LENGTH];
  ui32_t rip_size = 0;

  if ( ASDCP_SUCCESS(result) )
    {
      result = Reader.Read(intbuf, MXF_BER_LENGTH, &read_count);

      if ( ASDCP_SUCCESS(result) && read_count != 4 )
	{
	  DefaultLogSink().Error("RIP contains fewer than four bytes.\n");
	  result = RESULT_FAIL;
	}
    }

  if ( ASDCP_SUCCESS(result) )
    {
      rip_size = KM_i32_BE(Kumu::cp2i<ui32_t>(intbuf));

      if ( rip_size > end_pos ) // RIP can't be bigger than the file
	{
	  DefaultLogSink().Error("RIP size impossibly large.\n");
	  return RESULT_FAIL;
	}
    }

  // reposition to start of RIP
  if ( ASDCP_SUCCESS(result) )
    result = Reader.Seek(end_pos - rip_size);

  return result;
}